

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void QtPromisePrivate::PromiseDispatch<QFuture<void>>::
     call<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>,tst_future::finallyRejected()::__0>
               (QPromiseResolve<void> *resolve,QPromiseReject<void> *reject,
               anon_class_8_1_6971b95b fn)

{
  RunFunctionTaskBase<void> *this;
  QFuture<void> QStack_38;
  TaskStartParameters local_28;
  
  local_28.threadPool = (QThreadPool *)QThreadPool::globalInstance();
  local_28.priority = 0;
  this = (RunFunctionTaskBase<void> *)operator_new(0x28);
  this->field_0x8 = 1;
  *(undefined ***)this = &PTR_run_001305b8;
  QFutureInterfaceBase::QFutureInterfaceBase(&(this->promise).super_QFutureInterfaceBase,NoState);
  *(undefined ***)&this->promise = &PTR__QFutureInterfaceBase_001305e8;
  *(undefined ***)this = &PTR_run_001303b0;
  QtConcurrent::RunFunctionTaskBase<void>::start(&QStack_38,this,&local_28);
  PromiseFulfill<QFuture<void>_>::call(&QStack_38,resolve,reject);
  QFutureInterfaceBase::~QFutureInterfaceBase(&QStack_38.d);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }